

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgGeneratorState.cpp
# Opt level: O1

void __thiscall
rsg::GeneratorState::GeneratorState
          (GeneratorState *this,ProgramParameters *programParams,Random *random)

{
  iterator __position;
  iterator __position_00;
  int local_30 [2];
  
  this->m_programParams = programParams;
  this->m_random = random;
  this->m_shaderParams = (ShaderParameters *)0x0;
  this->m_shader = (Shader *)0x0;
  NameAllocator::NameAllocator(&this->m_nameAllocator);
  this->m_expressionDepth = 0;
  this->m_varManager = (VariableManager *)0x0;
  this->m_statementStack = (vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> *)0x0;
  (this->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30[1] = 0;
  __position._M_current =
       (this->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&this->m_exprFlagStack,__position,(uint *)(local_30 + 1));
  }
  else {
    *__position._M_current = 0;
    (this->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  local_30[0] = 100;
  __position_00._M_current =
       (this->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->m_precedenceStack,__position_00,local_30);
  }
  else {
    *__position_00._M_current = 100;
    (this->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  return;
}

Assistant:

GeneratorState::GeneratorState (const ProgramParameters& programParams, de::Random& random)
	: m_programParams			(programParams)
	, m_random					(random)
	, m_shaderParams			(DE_NULL)
	, m_shader					(DE_NULL)
	, m_varManager				(DE_NULL)
	, m_statementStack			(DE_NULL)
	, m_expressionDepth			(0)
{
	m_exprFlagStack.push_back(0);
	m_precedenceStack.push_back(PRECEDENCE_MAX);
}